

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void writeWaveHeader(FILE *outFile,WaveFmt *fmt,uint32_t dataLength)

{
  uint32_t sizeField;
  ulong uVar1;
  undefined1 uVar2;
  int i;
  long lVar3;
  uint32_t sizeField_1;
  uint8_t sizeFieldBytes [4];
  uint8_t sizeFieldBytes_1 [4];
  uint8_t sizeFieldBytes_2 [4];
  undefined1 local_24 [4];
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  
  fwrite("RIFF",4,1,(FILE *)outFile);
  uVar1 = (ulong)(dataLength + 0x24);
  lVar3 = 0;
  do {
    local_24[lVar3] = (char)uVar1;
    uVar1 = uVar1 >> 8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  fwrite(local_24,4,1,(FILE *)outFile);
  fwrite("WAVE",4,1,(FILE *)outFile);
  fwrite("fmt ",4,1,(FILE *)outFile);
  uVar2 = 0x10;
  lVar3 = 0;
  do {
    local_20[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
    uVar2 = 0;
  } while (lVar3 != 4);
  fwrite(local_20,4,1,(FILE *)outFile);
  fwrite(fmt,0x10,1,(FILE *)outFile);
  fwrite("data",4,1,(FILE *)outFile);
  lVar3 = 0;
  do {
    local_1c[lVar3] = (char)dataLength;
    dataLength = dataLength >> 8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  fwrite(local_1c,4,1,(FILE *)outFile);
  return;
}

Assistant:

void writeWaveHeader(FILE* outFile, struct WaveFmt *fmt, uint32_t dataLength){
	fwrite("RIFF", 4, 1, outFile);
	writeLengthField(outFile, 4 + 24 /*fmt chunk*/ + 8 + dataLength);
	fwrite("WAVE", 4, 1, outFile);
	fwrite("fmt ", 4, 1, outFile);
	writeLengthField(outFile, 16);
	fwrite(fmt, 16, 1, outFile);
	fwrite("data", 4, 1, outFile);
	writeLengthField(outFile, dataLength);
}